

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

Message * Message::CopyToMemoryMappedFile(int fd)

{
  uint in_EAX;
  __off_t _Var1;
  ssize_t sVar2;
  Message *__dest;
  Message *this;
  int dummyVal;
  undefined8 uStack_18;
  
  uStack_18._0_4_ = in_EAX;
  printf("message size = %d\n",200);
  _Var1 = lseek(fd,200,0);
  if (_Var1 == -1) {
    CopyToMemoryMappedFile();
  }
  uStack_18 = (ulong)(uint)uStack_18;
  sVar2 = write(fd,(void *)((long)&uStack_18 + 4),1);
  if (sVar2 == -1) {
    CopyToMemoryMappedFile();
  }
  __dest = (Message *)mmap((void *)0x0,200,3,1,fd,0);
  if (__dest == (Message *)0xffffffffffffffff) {
    CopyToMemoryMappedFile();
  }
  this = (Message *)operator_new(200);
  Message(this);
  memcpy(__dest,this,200);
  operator_delete(this,200);
  return __dest;
}

Assistant:

Message *Message::CopyToMemoryMappedFile(int fd)
{
    int datasize = sizeof(Message);
    printf("message size = %d\n", datasize);
    if(lseek(fd, sizeof(Message), SEEK_SET) == (-1))
    {
        fprintf(stderr, "error in lseek\n");
    }
    int dummyVal = 0;
    if(write(fd, (char*)&dummyVal, sizeof(char)) == (-1))
    {
        fprintf(stderr, "error in write\n");
    }
    void *map = mmap(NULL, sizeof(Message), (PROT_READ|PROT_WRITE), MAP_SHARED, fd, 0);
    if(map == (void*)(-1))
    {
        fprintf(stderr, "mmap() returned -1\n");
    }
    Message *msg = new Message();
    memcpy(map, (void*)msg, sizeof(Message));
    delete msg;
    return (Message*)map;
}